

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh)

{
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoPoint>).super_TPZGeoEl =
       &PTR__TPZSavable_016b3850;
  TPZGeoElRefLess<pzgeom::TPZGeoPoint>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoPoint>,&PTR_PTR_016b1548,nodeindices,matind,
             mesh);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoPoint>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016b1248;
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(nodeindices,matind,mesh) {
}